

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::jsonpath::detail::
or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::evaluate
          (or_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,const_reference lhs,const_reference rhs,error_code *param_3)

{
  bool bVar1;
  undefined8 extraout_RDX;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar2;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(rhs);
  if (bVar1) {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_3);
    if (bVar1) {
      param_3 = (error_code *)
                basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::null();
      goto LAB_003d9fe4;
    }
  }
  bVar1 = is_false<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>(rhs);
  if (!bVar1) {
    param_3 = (error_code *)rhs;
  }
LAB_003d9fe4:
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::uninitialized_copy
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)param_3);
  bVar2.field_0.int64_.val_ = extraout_RDX;
  bVar2.field_0._0_8_ = this;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar2.field_0;
}

Assistant:

Json evaluate(const_reference lhs, const_reference rhs, std::error_code&) const override
        {
            if (lhs.is_null() && rhs.is_null())
            {
                return Json::null();
            }
            if (!is_false(lhs))
            {
                return lhs;
            }
            return rhs;
        }